

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O0

void * __thiscall Lib::FixedSizeAllocator<8UL>::alloc(FixedSizeAllocator<8UL> *this)

{
  char *pcVar1;
  Block *in_RDI;
  void *recycled;
  char *local_8;
  
  if (in_RDI[1].bytes == (char *)0x0) {
    if (in_RDI->remaining == 0) {
      pcVar1 = (char *)::operator_new(0x2000);
      in_RDI->bytes = pcVar1;
      in_RDI->remaining = 0x2000;
      local_8 = (char *)Block::alloc(in_RDI);
    }
    else {
      local_8 = (char *)Block::alloc(in_RDI);
    }
  }
  else {
    local_8 = in_RDI[1].bytes;
    in_RDI[1].bytes = *(char **)in_RDI[1].bytes;
  }
  return local_8;
}

Assistant:

void *alloc() {
    // first look if there's anything in the free list
    if(free_list) {
      void *recycled = free_list;
      free_list = static_cast<void **>(*free_list);
      return recycled;
    }

    // then check if the current block has space
    if(current.remaining)
      return current.alloc();

    // current block full, get a new one
    current.bytes = static_cast<char *>(::operator new(COUNT * SIZE));
    current.remaining = COUNT * SIZE;
    return current.alloc();
  }